

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

uint32_t reconstructDFDBytesPlane0FromSamples(uint32_t *DFD)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = DFD[7];
  uVar3 = (DFD[2] >> 0x12) - 6 >> 2;
  uVar2 = 8;
  if ((uVar1 & 0xf000000) == 0xe000000) {
    if (uVar3 == 2) {
      if ((char)(uVar1 >> 0x10) == '\x0f') {
        return 4;
      }
      if (((uVar1 >> 0x10 & 0xff) == 0x1f) && ((DFD[0xb] & 0xf000000) == 0xd000000)) {
        return 8;
      }
    }
    else if ((uVar3 == 1) && ((uVar1 & 0xff0000) == 0x170000)) {
      return 4;
    }
  }
  if ((char)DFD[3] != -0x5d) {
    puVar4 = DFD + 7;
    uVar1 = 0;
    uVar6 = 0;
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (uVar1 < (ushort)*puVar4) {
        uVar6 = uVar5 & 0xffffffff;
        uVar1 = (uint)(ushort)*puVar4;
      }
      puVar4 = puVar4 + 4;
    }
    uVar2 = uVar1 + *(byte *)((long)DFD + (ulong)((int)uVar6 * 4 + 6) * 4 + 6) + 1 >> 3;
  }
  return uVar2;
}

Assistant:

uint32_t
reconstructDFDBytesPlane0FromSamples(const uint32_t* DFD)
{
    const uint32_t *BDFDB = DFD+1;
    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    uint32_t sampleNumber;

    uint32_t bitsPlane0 = 0;
    int32_t largestOffset = 0;
    uint32_t sampleNumberWithLargestOffset = 0;

    // Special case these depth{,-stencil} formats. The unused bits are
    // in the MSBs so have no visibility in the DFD therefore the max offset
    // algorithm below returns a value that is too small.
    if (KHR_DFDSVAL(BDFDB, 0, CHANNELID) == KHR_DF_CHANNEL_COMMON_DEPTH) {
        if (numSamples == 1) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 24) {
                // X8_D24_UNORM_PACK32,
                return 4;
            }
        } else if (numSamples == 2) {
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 16) {
                // D16_UNORM_S8_UINT
                return 4;
            }
            if (KHR_DFDSVAL(BDFDB, 0, BITLENGTH) + 1 == 32
                && KHR_DFDSVAL(BDFDB, 1, CHANNELID) == KHR_DF_CHANNEL_COMMON_STENCIL) {
                // D32_SFLOAT_S8_UINT
                return 8;
            }
        }
    }
    if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_ETC1S) {
        // Size of the first plane.
        return 8;
    }
    for (sampleNumber = 0; sampleNumber < numSamples; ++sampleNumber) {
        int32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleNumber, BITOFFSET);
        if (sampleBitOffset > largestOffset) {
            largestOffset = sampleBitOffset;
            sampleNumberWithLargestOffset = sampleNumber;
        }
    }

    /* The sample bitLength field stores the bit length - 1. */
    uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleNumberWithLargestOffset, BITLENGTH) + 1;
    bitsPlane0 = largestOffset + sampleBitLength;
    return bitsPlane0 >> 3U;
}